

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O3

void lws_cache_heap_item_destroy
               (lws_cache_ttl_lru_t_heap_t *cache,lws_cache_ttl_item_heap_t *item,int parent_too)

{
  lws_dll2 *plVar1;
  size_t sVar2;
  uint32_t uVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  lws_cache_ttl_lru_t_heap_t *plVar7;
  lws_cache_ttl_item_heap_t *plVar8;
  lws_dll2 *plVar9;
  lws_cache_ttl_item_heap_t *__s;
  
  if (*(char *)((long)&item[1].list_expiry.prev + item->size) != '!') {
    plVar7 = (lws_cache_ttl_lru_t_heap_t *)(cache->cache).info.parent;
    plVar9 = (cache->items_lru).head;
    if (plVar7 == (lws_cache_ttl_lru_t_heap_t *)0x0) {
      plVar7 = cache;
    }
    if (plVar9 != (lws_dll2 *)0x0) {
      pcVar5 = (char *)((long)&item[1].list_expiry.prev + item->size);
      do {
        plVar1 = plVar9->next;
        sVar2 = item->size;
        if (*(char *)((long)&item[1].list_expiry.prev + sVar2) == '!') {
          __s = (lws_cache_ttl_item_heap_t *)((long)&item[1].list_expiry.prev + sVar2);
          sVar6 = strlen((char *)__s);
          if (0 < (long)sVar2) {
            plVar8 = item + 1;
            do {
              uVar3 = lws_ser_ru32be((uint8_t *)((long)&(plVar8->list_expiry).prev + 4));
              if ((sVar6 == uVar3) &&
                 (iVar4 = strcmp((char *)&(plVar8->list_expiry).next,(char *)__s), iVar4 == 0)) {
                iVar4 = (*((plVar7->cache).info.ops)->tag_match)
                                  (&plVar7->cache,
                                   (char *)((long)&item[1].list_expiry.prev + sVar2 + 1),pcVar5,
                                   '\x01');
                if (iVar4 != 0) {
                  __assert_fail("!backing->info.ops->tag_match( backing, iname + 1, tag, 1)",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/misc/cache-ttl/heap.c"
                                ,0x7f,
                                "void lws_cache_heap_item_destroy(lws_cache_ttl_lru_t_heap_t *, lws_cache_ttl_item_heap_t *, int)"
                               );
                }
                _lws_cache_heap_item_destroy(cache,(lws_cache_ttl_item_heap_t *)(plVar9 + -1));
                break;
              }
              plVar8 = (lws_cache_ttl_item_heap_t *)
                       ((long)&(plVar8->list_expiry).prev + (ulong)(uVar3 + 9));
            } while (plVar8 < __s);
          }
          iVar4 = (*((plVar7->cache).info.ops)->tag_match)
                            (&plVar7->cache,(char *)((long)&item[1].list_expiry.prev + sVar2 + 1),
                             pcVar5,'\x01');
          if (iVar4 == 0) {
            __assert_fail("backing->info.ops->tag_match(backing, iname + 1, tag, 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/misc/cache-ttl/heap.c"
                          ,0x8e,
                          "void lws_cache_heap_item_destroy(lws_cache_ttl_lru_t_heap_t *, lws_cache_ttl_item_heap_t *, int)"
                         );
          }
        }
        plVar9 = plVar1;
      } while (plVar1 != (lws_dll2 *)0x0);
    }
  }
  _lws_cache_heap_item_destroy(cache,item);
  return;
}

Assistant:

static void
_lws_cache_heap_item_destroy(lws_cache_ttl_lru_t_heap_t *cache,
			     lws_cache_ttl_item_heap_t *item)
{
	lwsl_cache("%s: %s (%s)\n", __func__, cache->cache.info.name,
			(const char *)&item[1] + item->size);

	lws_dll2_remove(&item->list_expiry);
	lws_dll2_remove(&item->list_lru);

	cache->cache.current_footprint -= item->size;

	update_sul(cache);

	if (cache->cache.info.cb)
		cache->cache.info.cb((void *)((uint8_t *)&item[1]), item->size);

	lws_free(item);
}